

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O1

void __thiscall cxxpool::thread_pool::worker(thread_pool *this)

{
  function<void_()> *__x;
  bool bVar1;
  bool bVar2;
  _Manager_operation extraout_EDX;
  _Any_data *in_RSI;
  _Any_data *p_Var3;
  undefined1 local_90 [8];
  priority_task task;
  undefined1 local_48 [8];
  unique_lock<std::mutex> task_lock;
  
  task.order_.count_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&this->task_mutex_;
  task_lock._8_8_ = &this->tasks_;
  do {
    detail::priority_task::priority_task((priority_task *)local_90);
    local_48 = (undefined1  [8])
               task.order_.count_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    task_lock._M_device._0_1_ = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
    task_lock._M_device._0_1_ = 1;
LAB_001aa48a:
    if (this->paused_ != false) {
LAB_001aa4a0:
      in_RSI = (_Any_data *)local_48;
      std::condition_variable::wait((unique_lock *)&this->task_cond_var_);
      goto LAB_001aa48a;
    }
    if (this->done_ == false) {
      if ((this->tasks_).c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->tasks_).c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001aa4bb;
      goto LAB_001aa4a0;
    }
    if ((this->tasks_).c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->tasks_).c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
      bVar1 = false;
      goto LAB_001aa4ff;
    }
LAB_001aa4bb:
    __x = *(function<void_()> **)task_lock._8_8_;
    std::function<void_()>::operator=((function<void_()> *)local_90,__x);
    task.callback_._M_invoker = *(_Invoker_type *)&__x[1].super__Function_base._M_functor;
    in_RSI = (_Any_data *)((long)&__x[1].super__Function_base._M_functor + 8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&task.priority_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
    std::
    priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
    ::pop((priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
           *)task_lock._8_8_);
    bVar2 = false;
    bVar1 = true;
LAB_001aa4ff:
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
    p_Var3 = (_Any_data *)local_90;
    if (bVar1) {
      if (task.callback_.super__Function_base._M_functor._8_8_ == 0) {
        std::__throw_bad_function_call();
      }
      bVar2 = false;
      (*task.callback_.super__Function_base._M_manager)(p_Var3,in_RSI,extraout_EDX);
    }
    if (task.priority_ != 0) {
      in_RSI = (_Any_data *)
               ((long)task.order_.count_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - task.priority_);
      operator_delete((void *)task.priority_,(ulong)in_RSI);
    }
    if (task.callback_.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)task.callback_.super__Function_base._M_functor._8_8_)(p_Var3,p_Var3,3);
      in_RSI = p_Var3;
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void worker() {
        for (;;) {
            cxxpool::detail::priority_task task;
            {
                std::unique_lock<std::mutex> task_lock(task_mutex_);
                task_cond_var_.wait(task_lock, [this]{
                    return !paused_ && (done_ || !tasks_.empty());
                });
                if (done_ && tasks_.empty())
                    break;
                task = tasks_.top();
                tasks_.pop();
            }
            task();
        }
    }